

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O3

void pce_incbat(int *ip)

{
  byte bVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  ulong in_R11;
  undefined1 auVar15 [16];
  byte bVar16;
  char cVar17;
  byte bVar22;
  char cVar23;
  byte bVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar32;
  undefined1 auVar18 [16];
  undefined1 auVar33 [16];
  int h;
  int w;
  int y;
  int x;
  uint local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  int local_5c;
  uchar *local_58;
  long local_50;
  long local_48;
  ulong local_40;
  uint *local_38;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined2 uVar31;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar6 = pcx_get_args(ip);
  if (iVar6 != 0) {
    iVar6 = pcx_parse_args(1,pcx_nb_args + -1,&local_5c,&local_60,(int *)&local_68,(int *)&local_6c,
                           8);
    if (iVar6 != 0) {
      if (0 < (int)local_6c && pass == 1) {
        local_64 = local_6c;
        local_40 = (ulong)local_6c;
        uVar8 = pcx_arg[0] >> 4;
        local_50 = (long)local_60;
        lVar11 = (long)pcx_w;
        local_58 = pcx_buf + local_5c;
        local_48 = lVar11 * 8;
        uVar9 = 0;
        bVar5 = false;
        iVar6 = 0;
        puVar12 = (uint *)(pcx_buf + local_50 * lVar11 + (long)local_5c + 4);
        do {
          local_38 = puVar12;
          if (0 < (int)local_68) {
            uVar10 = 0;
            puVar12 = local_38;
            do {
              bVar1 = local_58[uVar10 * 8 + (local_50 + uVar9 * 8) * lVar11];
              auVar15 = pshuflw(ZEXT216(CONCAT11(bVar1,bVar1)),ZEXT216(CONCAT11(bVar1,bVar1)),0);
              iVar7 = 8;
              puVar13 = puVar12;
              do {
                auVar33 = ZEXT416(*puVar13) ^ auVar15 | ZEXT416(puVar13[-1]) ^ auVar15;
                bVar16 = auVar33[0];
                bVar22 = auVar33[1];
                bVar24 = auVar33[2];
                bVar26 = auVar33[3];
                cVar28 = auVar33[4];
                cVar29 = auVar33[5];
                cVar30 = auVar33[6];
                cVar32 = auVar33[7];
                cVar17 = -((byte)((0xf < bVar16) * '\x0f' | (0xf >= bVar16) * bVar16) == bVar16);
                cVar23 = -((byte)((0xf < bVar22) * '\x0f' | (0xf >= bVar22) * bVar22) == bVar22);
                cVar25 = -((byte)((0xf < bVar24) * '\x0f' | (0xf >= bVar24) * bVar24) == bVar24);
                cVar27 = -((byte)((0xf < bVar26) * '\x0f' | (0xf >= bVar26) * bVar26) == bVar26);
                cVar28 = -((char)((cVar28 == '\0') * cVar28) == cVar28);
                cVar29 = -((char)((cVar29 == '\0') * cVar29) == cVar29);
                cVar30 = -((char)((cVar30 == '\0') * cVar30) == cVar30);
                cVar32 = -((char)((cVar32 == '\0') * cVar32) == cVar32);
                Var4 = CONCAT91(CONCAT81((long)(CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(
                                                  CONCAT21(CONCAT11(cVar32,cVar32),cVar30),cVar30),
                                                  cVar29),cVar29),cVar28),CONCAT11(cVar28,cVar32))
                                               >> 8),cVar27),cVar27);
                auVar3._2_10_ = Var4;
                auVar3[1] = cVar25;
                auVar3[0] = cVar25;
                auVar2._2_12_ = auVar3;
                auVar2[1] = cVar23;
                auVar2[0] = cVar23;
                auVar33._0_2_ = CONCAT11(cVar17,cVar17);
                auVar33._2_14_ = auVar2;
                uVar31 = (undefined2)Var4;
                auVar21._0_12_ = auVar33._0_12_;
                auVar21._12_2_ = uVar31;
                auVar21._14_2_ = uVar31;
                auVar20._12_4_ = auVar21._12_4_;
                auVar20._0_10_ = auVar33._0_10_;
                auVar20._10_2_ = auVar3._0_2_;
                auVar19._10_6_ = auVar20._10_6_;
                auVar19._0_8_ = auVar33._0_8_;
                auVar19._8_2_ = auVar3._0_2_;
                auVar18._8_8_ = auVar19._8_8_;
                auVar18._6_2_ = auVar2._0_2_;
                auVar18._4_2_ = auVar2._0_2_;
                auVar18._2_2_ = auVar33._0_2_;
                auVar18._0_2_ = auVar33._0_2_;
                uVar14 = movmskps((int)in_R11,auVar18);
                in_R11 = (ulong)(uVar14 ^ 0xf);
                if ((uVar14 ^ 0xf) != 0) {
                  bVar5 = true;
                }
                puVar13 = (uint *)((long)puVar13 + lVar11);
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
              buffer[(uint)(iVar6 * 2)] = (uchar)uVar8;
              buffer[(ulong)(uint)(iVar6 * 2) + 1] = (byte)(uVar8 >> 8) & 0xf | bVar1 & 0xf0;
              iVar6 = iVar6 + 1;
              uVar8 = uVar8 + 1;
              uVar10 = uVar10 + 1;
              puVar12 = puVar12 + 2;
            } while (uVar10 != local_68);
          }
          uVar9 = uVar9 + 1;
          puVar12 = local_38 + lVar11 * 2;
        } while (uVar9 != local_40);
        if (bVar5) {
          error("Invalid color index found!");
        }
      }
      putbuffer(buffer,local_6c * local_68 * 2);
      if (pass == 1) {
        println();
      }
    }
  }
  return;
}

Assistant:

void
pce_incbat(int *ip)
{
	unsigned char *ptr, ref;
	int i, j, k, l, x, y, w, h;
	unsigned int base, index, flag;
	unsigned int temp;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(1, pcx_nb_args - 1, &x, &y, &w, &h, 8))
		return;

	/* build the BAT */
	if (pass == LAST_PASS) {
		index = 0;
		flag  = 0;
		base  = (pcx_arg[0] >> 4);

		for (i = 0; i < h; i++) {
			for (j = 0; j < w; j++) {
				ptr = pcx_buf + (x + (j * 8)) + ((y + (i * 8)) * pcx_w);
				ref = ptr[0] & 0xF0;

				/* check colors */
				for (k = 0; k < 8; k++) {
					for (l = 0; l < 8; l++) {
						if ((ptr[l] & 0xF0) != ref)
							flag = 1;
					}				
					ptr += pcx_w;
				}
				temp = (base & 0xFFF) | ((ref & 0xF0) << 8);
				buffer[2*index]   = temp & 0xff;
				buffer[2*index+1] = temp >> 8;

				index++;
				base++;
			}
		}

		/* errors */
		if (flag)
			error("Invalid color index found!");
	}

	/* store data */
	putbuffer(buffer, 2 * w * h);

	/* output */
	if (pass == LAST_PASS)
		println();
}